

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_init(jx9 **ppEngine)

{
  jx9 *pBackend;
  int rc;
  jx9 *pEngine;
  jx9 **ppEngine_local;
  
  *ppEngine = (jx9 *)0x0;
  ppEngine_local._4_4_ = Jx9CoreInitialize();
  if (ppEngine_local._4_4_ == 0) {
    pBackend = (jx9 *)SyMemBackendPoolAlloc(&sJx9MPGlobal.sAllocator,0x118);
    if (pBackend == (jx9 *)0x0) {
      ppEngine_local._4_4_ = -1;
    }
    else {
      SyZero(pBackend,0x118);
      pBackend->nMagic = 0xf874bcd7;
      ppEngine_local._4_4_ =
           SyMemBackendInitFromParent((SyMemBackend *)pBackend,&sJx9MPGlobal.sAllocator);
      if (ppEngine_local._4_4_ == 0) {
        SyBlobInit(&(pBackend->xConf).sErrConsumer,(SyMemBackend *)pBackend);
        (pBackend->xConf).xErr = jx9VmBlobConsumer;
        (pBackend->xConf).pErrData = &(pBackend->xConf).sErrConsumer;
        pBackend->pVfs = sJx9MPGlobal.pVfs;
        if (sJx9MPGlobal.pEngines != (jx9 *)0x0) {
          pBackend->pNext = sJx9MPGlobal.pEngines;
          (sJx9MPGlobal.pEngines)->pPrev = pBackend;
        }
        sJx9MPGlobal.nEngine = sJx9MPGlobal.nEngine + 1;
        sJx9MPGlobal.pEngines = pBackend;
        *ppEngine = pBackend;
        ppEngine_local._4_4_ = 0;
      }
      else {
        SyMemBackendRelease((SyMemBackend *)pBackend);
        SyMemBackendPoolFree(&sJx9MPGlobal.sAllocator,pBackend);
      }
    }
  }
  return ppEngine_local._4_4_;
}

Assistant:

JX9_PRIVATE int jx9_init(jx9 **ppEngine)
{
	jx9 *pEngine;
	int rc;
#if defined(UNTRUST)
	if( ppEngine == 0 ){
		return JX9_CORRUPT;
	}
#endif
	*ppEngine = 0;
	/* One-time automatic library initialization */
	rc = Jx9CoreInitialize();
	if( rc != JX9_OK ){
		return rc;
	}
	/* Allocate a new engine */
	pEngine = (jx9 *)SyMemBackendPoolAlloc(&sJx9MPGlobal.sAllocator, sizeof(jx9));
	if( pEngine == 0 ){
		return JX9_NOMEM;
	}
	/* Zero the structure */
	SyZero(pEngine, sizeof(jx9));
	/* Initialize engine fields */
	pEngine->nMagic = JX9_ENGINE_MAGIC;
	rc = SyMemBackendInitFromParent(&pEngine->sAllocator, &sJx9MPGlobal.sAllocator);
	if( rc != JX9_OK ){
		goto Release;
	}
//#if defined(JX9_ENABLE_THREADS)
//	SyMemBackendDisbaleMutexing(&pEngine->sAllocator);
//#endif
	/* Default configuration */
	SyBlobInit(&pEngine->xConf.sErrConsumer, &pEngine->sAllocator);
	/* Install a default compile-time error consumer routine */
	pEngine->xConf.xErr = jx9VmBlobConsumer;
	pEngine->xConf.pErrData = &pEngine->xConf.sErrConsumer;
	/* Built-in vfs */
	pEngine->pVfs = sJx9MPGlobal.pVfs;
#if defined(JX9_ENABLE_THREADS)
	if( sJx9MPGlobal.nThreadingLevel > JX9_THREAD_LEVEL_SINGLE ){
		 /* Associate a recursive mutex with this instance */
		 pEngine->pMutex = SyMutexNew(sJx9MPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pEngine->pMutex == 0 ){
			 rc = JX9_NOMEM;
			 goto Release;
		 }
	 }
#endif
	/* Link to the list of active engines */
#if defined(JX9_ENABLE_THREADS)
	/* Enter the global mutex */
	 SyMutexEnter(sJx9MPGlobal.pMutexMethods, sJx9MPGlobal.pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel == JX9_THREAD_LEVEL_SINGLE */
#endif
	MACRO_LD_PUSH(sJx9MPGlobal.pEngines, pEngine);
	sJx9MPGlobal.nEngine++;
#if defined(JX9_ENABLE_THREADS)
	/* Leave the global mutex */
	 SyMutexLeave(sJx9MPGlobal.pMutexMethods, sJx9MPGlobal.pMutex); /* NO-OP if sJx9MPGlobal.nThreadingLevel == JX9_THREAD_LEVEL_SINGLE */
#endif
	/* Write a pointer to the new instance */
	*ppEngine = pEngine;
	return JX9_OK;
Release:
	SyMemBackendRelease(&pEngine->sAllocator);
	SyMemBackendPoolFree(&sJx9MPGlobal.sAllocator,pEngine);
	return rc;
}